

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSExporter::WritePercentChunk(Discreet3DSExporter *this,float f)

{
  ChunkWriter chunk;
  
  anon_unknown_0::ChunkWriter::ChunkWriter(&chunk,&this->writer,0x31);
  StreamWriter<false,_false>::Put<float>(&this->writer,f);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk);
  return;
}

Assistant:

void Discreet3DSExporter::WritePercentChunk(float f) {
    ChunkWriter chunk(writer, Discreet3DS::CHUNK_PERCENTF);
    writer.PutF4(f);
}